

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgsitrf.c
# Opt level: O3

void zgsitrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,
            void *work,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,
            GlobalLU_t *Glu,SuperLUStat_t *stat,int_t *info)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  fact_t fVar4;
  superlu_options_t *psVar5;
  long lVar6;
  int_t iVar7;
  int iVar8;
  int iVar9;
  int_t iVar10;
  int iVar11;
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  double *amax;
  int_t *piVar15;
  int_t *piVar16;
  ulong uVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  doublecomplex *z;
  uint uVar25;
  long lVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined4 uVar30;
  undefined4 uVar31;
  int local_280;
  int nnzLj;
  uint local_278;
  int pivrow;
  ulong local_270;
  int *local_268;
  int_t *local_260;
  int_t *local_258;
  double local_250;
  double local_248;
  double local_240;
  ulong local_238;
  double local_230;
  int_t nnzL;
  int usepr;
  int nseg;
  int *marker;
  double local_210;
  double fill_tol;
  int local_1fc;
  uint local_1f8;
  int nseg1;
  double *local_1f0;
  long local_1e8;
  int_t *local_1e0;
  doublecomplex *dense;
  int *repfnz;
  int *segrep;
  double local_1c0;
  int_t *local_1b8;
  int *local_1b0;
  doublecomplex *tempv;
  int local_19c;
  fact_t local_198;
  int nnzUj;
  int_t nnzU;
  int_t nzlumax;
  ulong local_188;
  int *local_180;
  int *local_178;
  double local_170;
  ulong local_168;
  int_t *local_160;
  ulong local_158;
  int_t *local_150;
  double local_148;
  ulong local_140;
  doublecomplex local_138;
  ulong local_128;
  int_t *local_120;
  superlu_options_t *local_118;
  int_t *local_110;
  int_t *local_108;
  ulong local_100;
  double local_f8;
  int *local_f0;
  int_t *local_e8;
  long local_e0;
  int *local_d8;
  int_t *xplore;
  SuperMatrix *local_c8;
  double local_c0;
  double local_b8;
  long local_b0;
  int *local_a8;
  long local_a0;
  double local_98;
  int *panel_lsub;
  int *parent;
  doublecomplex *zwork;
  int *iwork;
  int_t *local_70;
  int_t *local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  flops_t *local_40;
  int_t *xprune;
  
  local_168 = (ulong)(uint)panel_size;
  local_98 = options->DiagPivotThresh;
  local_170 = options->ILU_DropTol;
  local_210 = options->ILU_FillTol;
  uVar25 = A->nrow;
  uVar23 = (ulong)uVar25;
  uVar2 = A->ncol;
  uVar21 = uVar2;
  if ((int)uVar25 < (int)uVar2) {
    uVar21 = uVar25;
  }
  local_240 = options->ILU_FillFactor;
  local_198 = options->Fact;
  local_158 = (ulong)(uint)options->ILU_DropRule;
  local_140 = (ulong)options->ILU_MILU;
  local_a8 = stat->panel_histo;
  local_40 = stat->ops;
  piVar15 = (int_t *)A->Store;
  local_e0 = *(long *)(piVar15 + 2);
  local_1e0 = *(int_t **)(piVar15 + 4);
  local_260 = *(int_t **)(piVar15 + 6);
  local_258 = *(int_t **)(piVar15 + 8);
  local_268 = etree;
  iVar7 = zLUMemInit(local_198,work,lwork,uVar25,uVar2,*piVar15,panel_size,local_240,L,U,Glu,&iwork,
                     &zwork);
  *info = iVar7;
  if (iVar7 != 0) {
    return;
  }
  local_180 = Glu->xsup;
  local_178 = Glu->supno;
  local_160 = Glu->xlsub;
  local_108 = Glu->xlusup;
  local_e8 = Glu->xusub;
  iVar11 = (int)local_168;
  local_278 = uVar21;
  local_188 = (ulong)uVar2;
  local_118 = options;
  local_110 = piVar15;
  local_c8 = A;
  SetIWork(uVar25,uVar2,iVar11,iwork,&segrep,&parent,&xplore,&repfnz,&panel_lsub,&xprune,&marker);
  local_1b0 = int32Malloc(uVar25);
  superlu_free(xprune);
  zSetRWork(uVar25,iVar11,zwork,&dense,&tempv);
  usepr = (int)(local_198 == SamePattern_SameRowPerm);
  if (local_198 == SamePattern_SameRowPerm) {
    local_f0 = int32Malloc(uVar25);
    if (0 < (int)uVar25) {
      uVar12 = 0;
      do {
        local_f0[perm_r[uVar12]] = (int)uVar12;
        uVar12 = uVar12 + 1;
      } while (uVar23 != uVar12);
    }
  }
  else {
    local_f0 = (int *)0x0;
  }
  uVar12 = local_188;
  iVar11 = (int)local_188;
  piVar13 = int32Malloc(iVar11);
  if (iVar11 < 1) {
    local_1b8 = intMalloc(iVar11);
  }
  else {
    uVar14 = 0;
    do {
      piVar13[perm_c[uVar14]] = (int)uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar12 != uVar14);
    local_1b8 = intMalloc(iVar11);
    if (0 < iVar11) {
      uVar14 = 0;
      do {
        local_1b8[uVar14] = piVar13[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
      local_150 = intMalloc(iVar11);
      if (0 < iVar11) {
        uVar14 = 0;
        do {
          local_150[uVar14] = perm_c[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar12 != uVar14);
      }
      goto LAB_0010a895;
    }
  }
  local_150 = intMalloc(iVar11);
LAB_0010a895:
  lVar26 = (long)iVar11;
  amax = (double *)superlu_malloc((long)(int)local_168 << 3);
  local_b0 = lVar26;
  if ((local_158 & 0xe) == 0) {
    local_1f0 = (double *)0x0;
  }
  else {
    local_1f0 = (double *)superlu_malloc(lVar26 * 8);
  }
  nnzLj = 0;
  nnzUj = 0;
  iVar8 = sp_ienv(7);
  uVar2 = local_278;
  local_148 = (double)(int)local_278;
  local_1fc = (int)(local_148 * 0.95);
  if (local_1fc < (int)(local_278 + iVar8 * -2)) {
    iVar8 = sp_ienv(7);
    local_1fc = uVar2 + iVar8 * -2;
  }
  psVar5 = local_118;
  local_230 = pow((double)iVar11,-1.0 / local_118->ILU_MILU_Dim);
  piVar15 = intMalloc(iVar11);
  piVar16 = intMalloc(iVar11);
  local_d8 = piVar13;
  if (psVar5->SymmetricMode == YES) {
    ilu_heap_relax_snode(iVar11,local_268,relax,marker,piVar15,piVar16);
  }
  else {
    ilu_relax_snode(iVar11,local_268,relax,marker,piVar15,piVar16);
  }
  ifill(perm_r,uVar25,-1);
  ifill(marker,uVar25 * 3,-1);
  piVar13 = local_1b0;
  *local_178 = -1;
  *local_108 = 0;
  *local_e8 = 0;
  *local_160 = 0;
  local_268 = (int *)((ulong)local_268 & 0xffffffff00000000);
  *local_180 = 0;
  ifill(local_1b0,uVar25,-1);
  local_68 = piVar16;
  mark_relax(uVar25,piVar15,piVar16,local_260,local_258,local_1e0,piVar13);
  local_238 = uVar23;
  local_120 = piVar15;
  if (0 < (int)local_278) {
    local_a0 = (long)(int)uVar25;
    local_248 = (double)(int)uVar25;
    local_19c = iVar11 * uVar25;
    auVar29._0_4_ = -(uint)((local_158 & 0x10) == 0);
    auVar29._4_4_ = -(uint)((local_158 & 8) == 0);
    auVar29._8_4_ = -(uint)((local_158 & 4) == 0);
    auVar29._12_4_ = -(uint)((local_158 & 2) == 0);
    local_1f8 = movmskps(local_19c,auVar29);
    bVar18 = (byte)local_1f8;
    bVar19 = (bVar18 & 2) >> 1;
    bVar20 = (bVar18 & 4) >> 2;
    bVar18 = bVar18 >> 3;
    local_58 = local_a0 * 2;
    local_c0 = local_240 * 0.9;
    local_b8 = (1.0 - local_230) + (1.0 - local_230);
    local_60 = (long)local_1fc;
    local_70 = piVar15 + 1;
    local_1c0 = local_170;
    local_250 = local_170;
    local_50 = (long)(int)local_58;
    uVar23 = 0;
    local_268 = (int *)((ulong)local_268 & 0xffffffff00000000);
    local_280 = 0;
    do {
      iVar11 = (int)uVar23;
      local_100 = uVar23 & 0xffffffff;
      uVar14 = (ulong)iVar11;
      uVar25 = local_120[uVar14];
      uVar12 = (ulong)uVar25;
      iVar8 = (int)local_238;
      if (uVar25 == 0xffffffff) {
        uVar25 = (int)local_168 + iVar11;
        if ((int)local_278 <= (int)uVar25) {
          uVar25 = local_278;
        }
        uVar12 = 0;
        do {
          if ((long)(int)uVar25 <= (long)(uVar14 + 1 + uVar12)) {
            uVar25 = (int)uVar12 + iVar11 + 1;
            uVar17 = local_168;
            goto LAB_0010ad06;
          }
          uVar17 = uVar12 + 1;
          lVar26 = uVar14 + uVar12;
          uVar12 = uVar17;
        } while (local_70[lVar26] == -1);
        uVar25 = iVar11 + (int)uVar17;
LAB_0010ad06:
        iVar22 = local_278 - iVar11;
        if (uVar25 != local_278) {
          iVar22 = (int)uVar17;
        }
        local_a8[iVar22] = local_a8[iVar22] + 1;
        local_128 = uVar23;
        ilu_zpanel_dfs(iVar8,iVar22,iVar11,local_c8,perm_r,&nseg1,dense,amax,panel_lsub,segrep,
                       repfnz,marker,parent,xplore,Glu);
        zpanel_bmod(iVar8,iVar22,(int)local_128,nseg1,dense,tempv,segrep,repfnz,Glu,stat);
        uVar25 = (int)local_100 + iVar22;
        uVar23 = (ulong)uVar25;
        if (0 < iVar22) {
          local_48 = (long)(int)uVar25;
          uVar12 = uVar14;
          local_128 = (ulong)uVar25;
          do {
            local_230 = (double)(uVar12 - uVar14);
            lVar24 = (long)local_230 * local_a0;
            nseg = nseg1;
            iVar11 = local_258[uVar12];
            iVar8 = local_260[uVar12];
            lVar26 = lVar24 * 4;
            iVar9 = (int)uVar12;
            iVar22 = ilu_zcolumn_dfs((int)local_238,iVar9,perm_r,&nseg,panel_lsub + lVar24,segrep,
                                     repfnz + lVar24,marker,parent,xplore,Glu);
            *info = iVar22;
            if (iVar22 != 0) {
              return;
            }
            iVar22 = zcolumn_bmod(iVar9,nseg - nseg1,dense + lVar24,tempv,segrep + nseg1,
                                  repfnz + lVar24,(int)local_100,Glu,stat);
            lVar6 = local_58;
            piVar13 = marker;
            *info = iVar22;
            if (iVar22 != 0) {
              return;
            }
            local_270 = uVar12 + 1;
            uVar30 = SUB84(local_240,0);
            uVar31 = (undefined4)((ulong)local_240 >> 0x20);
            local_1e8 = lVar26;
            if (local_160[uVar12 + 1] == local_160[uVar12]) {
              nnzL = Glu->nzlmax;
              if (nnzL <= local_160[uVar12] + 1) {
                iVar7 = zLUMemXpand(iVar9,local_160[uVar12] + 1,LSUB,&nnzL,Glu);
                uVar30 = SUB84(local_240,0);
                uVar31 = (undefined4)((ulong)local_240 >> 0x20);
                if (iVar7 != 0) {
                  *info = iVar7;
                  return;
                }
              }
              piVar15 = Glu->lsub;
              local_160[local_270] = local_160[local_270] + 1;
              iVar22 = local_108[uVar12];
              if (iVar22 != local_108[local_270]) {
                __assert_fail("xlusup[jj]==xlusup[jj+1]",
                              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgsitrf.c"
                              ,0x1f5,
                              "void zgsitrf(superlu_options_t *, SuperMatrix *, int, int, int *, void *, int_t, int *, int *, SuperMatrix *, SuperMatrix *, GlobalLU_t *, SuperLUStat_t *, int_t *)"
                             );
              }
              local_108[local_270] = iVar22 + 1;
              puVar1 = (undefined8 *)((long)Glu->lusup + (long)iVar22 * 0x10);
              *puVar1 = 0;
              puVar1[1] = 0;
              uVar23 = uVar12;
              iVar22 = iVar9;
              if ((long)uVar12 < local_b0) {
                do {
                  uVar17 = uVar23;
                  if ((long)local_1b0[local_1b8[uVar23]] <= (long)uVar12) break;
                  uVar23 = uVar23 + 1;
                  uVar17 = local_188;
                } while ((long)uVar23 < local_b0);
                iVar22 = (int)uVar17;
              }
              iVar22 = local_1b8[iVar22];
              piVar13[lVar6 + iVar22] = iVar9;
              piVar15[local_160[uVar12]] = iVar22;
            }
            local_280 = local_280 + (iVar11 - iVar8);
            local_f8 = (double)iVar9;
            if (bVar18 == 0) {
              uVar23 = (ulong)(uint)(int)(((((double)*local_110 * (double)CONCAT44(uVar31,uVar30)) /
                                           local_248) * local_f8) / local_248);
            }
            else if (bVar20 == 0) {
              uVar23 = (ulong)(uint)(int)(((double)(int)local_270 *
                                          (double)(local_258[uVar12] - local_260[uVar12]) *
                                          (double)CONCAT44(uVar31,uVar30)) / local_248);
            }
            else {
              uVar23 = local_238;
              if (bVar19 == 0) {
                uVar23 = (ulong)(uint)(int)((double)local_280 * local_c0 * 0.5 - (double)nnzUj);
              }
            }
            iVar11 = ilu_zcopy_to_ucol(iVar9,nseg,segrep,(int *)((long)repfnz + local_1e8),perm_r,
                                       dense + lVar24,(int)local_158,(milu_t)local_140,
                                       amax[(long)local_230] * local_1c0,(int)uVar23,&local_138,
                                       &nnzUj,Glu,local_1f0);
            *info = iVar11;
            if (iVar11 != 0) {
              return;
            }
            if ((local_1f8 & 1) == 0) {
              if ((double)nnzLj <= (double)local_280 * local_c0 * 0.5) {
                dVar28 = local_1c0 * 0.5;
                local_1c0 = local_170;
                if (local_170 <= dVar28) {
                  local_1c0 = dVar28;
                }
              }
              else {
                dVar28 = local_1c0 + local_1c0;
                local_1c0 = 1.0;
                if (dVar28 <= 1.0) {
                  local_1c0 = dVar28;
                }
              }
            }
            if ((local_138.r != 0.0) || (NAN(local_138.r))) {
LAB_0010b288:
              dVar27 = z_abs1(&local_138);
              dVar28 = 1.0;
              if (local_b8 / dVar27 < 1.0) {
                dVar28 = z_abs1(&local_138);
                dVar28 = local_b8 / dVar28;
              }
              dVar27 = dVar28 * local_138.i;
              local_138.i._0_4_ = SUB84(dVar27,0);
              local_138.r = dVar28 * local_138.r;
              local_138.i._4_4_ = (int)((ulong)dVar27 >> 0x20);
            }
            else if ((local_138.i != 0.0) || (NAN(local_138.i))) goto LAB_0010b288;
            if (usepr != 0) {
              pivrow = local_f0[uVar12];
            }
            fill_tol = pow(local_210,1.0 - local_f8 / local_148);
            iVar11 = ilu_zpivotL(iVar9,local_98,&usepr,perm_r,local_d8[uVar12],local_1b8,local_150,
                                 local_1b0,&pivrow,fill_tol * amax[(long)local_230],
                                 (milu_t)local_140,local_138,Glu,stat);
            *info = iVar11;
            if (iVar11 != 0) {
              local_268 = (int *)CONCAT44(local_268._4_4_,(int)local_268 + 1);
              marker[pivrow + local_a0] = iVar9;
              marker[pivrow + local_50] = iVar9;
            }
            resetrep_col(nseg,segrep,(int *)(local_1e8 + (long)repfnz));
            if (((0 < (long)uVar12) && (local_178[uVar12 - 1] < local_178[uVar12])) &&
               ((long)uVar12 < local_60)) {
              iVar8 = iVar9 + -1;
              iVar11 = local_180[local_178[uVar12 - 1]];
              lVar26 = (long)iVar11;
              if (bVar18 == 0) {
                iVar22 = (int)((double)(iVar9 - iVar11) *
                              (((double)((int)local_238 - iVar11) *
                               (((double)*local_110 * local_240) / local_248)) / local_248));
              }
              else {
                if (bVar20 == 0) {
                  dVar28 = 0.0;
                  if (lVar26 < (long)uVar12) {
                    iVar22 = 0;
                    do {
                      iVar22 = (iVar22 + local_258[lVar26]) - local_260[lVar26];
                      lVar26 = lVar26 + 1;
                    } while (lVar26 < (long)uVar12);
                    dVar28 = (double)iVar22;
                  }
                  dVar28 = ((double)((int)local_238 - iVar11) * dVar28 * local_240) / local_248;
                }
                else {
                  iVar22 = local_19c;
                  if (bVar19 != 0) goto LAB_0010b55c;
                  dVar28 = ((((double)iVar8 + 1.0) * -0.5) / local_248 + 1.0) *
                           (double)local_280 * local_240 - (double)nnzLj;
                }
                iVar22 = (int)dVar28;
              }
LAB_0010b55c:
              fill_tol = pow(local_210,((double)(iVar8 + iVar11) * -0.5) / local_148 + 1.0);
              ilu_zdrop_row(local_118,iVar11,iVar8,local_250,iVar22,&nnzLj,&fill_tol,Glu,&tempv->r,
                            local_1f0,1);
              if ((local_1f8 & 1) == 0) {
                if ((double)nnzLj <=
                    ((((double)iVar8 + 1.0) * -0.5) / local_248 + 1.0) *
                    (double)local_280 * local_240) {
                  dVar28 = local_250 * 0.5;
                  local_250 = local_170;
                  if (local_170 <= dVar28) {
                    local_250 = dVar28;
                  }
                }
                else {
                  dVar28 = local_250 + local_250;
                  local_250 = 1.0;
                  if (dVar28 <= 1.0) {
                    local_250 = dVar28;
                  }
                }
              }
              dVar28 = fill_tol;
              if (0.0 <= fill_tol) {
                dVar28 = 0.0;
              }
              local_268 = (int *)CONCAT44(local_268._4_4_,(int)local_268 - (int)dVar28);
            }
            uVar23 = local_128;
            uVar12 = local_270;
          } while ((long)local_270 < local_48);
        }
      }
      else {
        iVar22 = uVar25 - iVar11;
        local_a8[(long)iVar22 + 1] = local_a8[(long)iVar22 + 1] + 1;
        local_270 = uVar12;
        if ((0 < iVar11) && (iVar11 < local_1fc)) {
          local_230 = (double)CONCAT44(local_230._4_4_,iVar22);
          uVar25 = iVar11 - 1;
          iVar22 = local_180[local_178[uVar25]];
          uVar23 = (ulong)iVar22;
          if (bVar18 == 0) {
            iVar8 = (int)((double)(iVar11 - iVar22) *
                         (((double)(iVar8 - iVar22) * (((double)*local_110 * local_240) / local_248)
                          ) / local_248));
          }
          else {
            if (bVar20 == 0) {
              dVar28 = 0.0;
              if (iVar22 < iVar11) {
                iVar9 = 0;
                do {
                  iVar9 = (iVar9 + local_258[uVar23]) - local_260[uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar14 != uVar23);
                dVar28 = (double)iVar9;
              }
              dVar28 = ((double)(iVar8 - iVar22) * dVar28 * local_240) / local_248;
            }
            else {
              iVar8 = local_19c;
              if (bVar19 != 0) goto LAB_0010b737;
              dVar28 = ((((double)(int)uVar25 + 1.0) * -0.5) / local_248 + 1.0) *
                       (double)local_280 * local_240 - (double)nnzLj;
            }
            iVar8 = (int)dVar28;
          }
LAB_0010b737:
          fill_tol = pow(local_210,((double)(int)(uVar25 + iVar22) * -0.5) / local_148 + 1.0);
          ilu_zdrop_row(local_118,iVar22,uVar25,local_250,iVar8,&nnzLj,&fill_tol,Glu,&tempv->r,
                        local_1f0,0);
          if ((local_1f8 & 1) == 0) {
            if ((double)nnzLj <=
                ((((double)(int)uVar25 + 1.0) * -0.5) / local_248 + 1.0) *
                (double)local_280 * local_240) {
              dVar28 = local_250 * 0.5;
              local_250 = local_170;
              if (local_170 <= dVar28) {
                local_250 = dVar28;
              }
            }
            else {
              dVar28 = local_250 + local_250;
              local_250 = 1.0;
              if (dVar28 <= 1.0) {
                local_250 = dVar28;
              }
            }
          }
          dVar28 = fill_tol;
          if (0.0 <= fill_tol) {
            dVar28 = 0.0;
          }
          local_268 = (int *)CONCAT44(local_268._4_4_,(int)local_268 - (int)dVar28);
          iVar22 = local_230._0_4_;
        }
        iVar8 = ilu_zsnode_dfs(iVar11,(int)local_270,local_1e0,local_260,local_258,marker,Glu);
        *info = iVar8;
        if (iVar8 != 0) {
          return;
        }
        local_230 = (double)CONCAT44(local_230._4_4_,local_e8[uVar14]);
        iVar7 = local_108[uVar14];
        local_1e8 = (long)local_178[uVar14];
        iVar8 = local_180[local_1e8];
        iVar9 = local_160[(long)iVar8 + 1];
        iVar3 = local_160[iVar8];
        nzlumax = Glu->nzlumax;
        while (nzlumax < (iVar9 - iVar3) * (iVar22 + 1) + iVar7) {
          iVar10 = zLUMemXpand(iVar11,iVar7,LUSUP,&nzlumax,Glu);
          *info = iVar10;
          if (iVar10 != 0) {
            return;
          }
        }
        uVar25 = (int)local_270 + 1;
        uVar23 = (ulong)uVar25;
        if ((int)local_100 <= (int)local_270) {
          do {
            local_e8[uVar14 + 1] = local_230._0_4_;
            *amax = 0.0;
            iVar11 = local_260[uVar14];
            lVar26 = (long)iVar11;
            if (iVar11 < local_258[uVar14]) {
              z = (doublecomplex *)(lVar26 * 0x10 + local_e0);
              do {
                dVar28 = z_abs1(z);
                if (*amax <= dVar28 && dVar28 != *amax) {
                  *amax = dVar28;
                }
                iVar11 = local_1e0[lVar26];
                dVar28 = z->i;
                dense[iVar11].r = z->r;
                dense[iVar11].i = dVar28;
                lVar26 = lVar26 + 1;
                z = z + 1;
              } while (lVar26 < local_258[uVar14]);
              local_280 = (local_258[uVar14] + local_280) - local_260[uVar14];
              if ((*amax == 0.0) && (!NAN(*amax))) goto LAB_0010ba58;
            }
            else {
              local_280 = (local_258[uVar14] + local_280) - iVar11;
LAB_0010ba58:
              *amax = local_210;
            }
            iVar11 = (int)uVar14;
            zsnode_bmod(iVar11,(int)local_1e8,iVar8,dense,tempv,Glu,stat);
            if (usepr != 0) {
              pivrow = local_f0[uVar14];
            }
            fill_tol = pow(local_210,1.0 - (double)iVar11 / local_148);
            iVar11 = ilu_zpivotL(iVar11,local_98,&usepr,perm_r,local_d8[uVar14],local_1b8,local_150,
                                 local_1b0,&pivrow,fill_tol * *amax,(milu_t)local_140,
                                 (doublecomplex)(ZEXT416(0) << 0x40),Glu,stat);
            *info = iVar11;
            if (iVar11 != 0) {
              local_268 = (int *)CONCAT44(local_268._4_4_,(int)local_268 + 1);
              marker[pivrow] = (int)local_270;
            }
            uVar14 = uVar14 + 1;
          } while (uVar25 != (uint)uVar14);
        }
      }
      uVar25 = (uint)local_238;
      uVar12 = local_188;
    } while ((int)uVar23 < (int)local_278);
  }
  uVar2 = local_278;
  *info = (int)local_268;
  if (0 < (int)uVar25 && (int)uVar12 < (int)uVar25) {
    uVar23 = 0;
    iVar11 = 0;
    do {
      if (perm_r[uVar23] == -1) {
        perm_r[uVar23] = iVar11 + (int)uVar12;
        iVar11 = iVar11 + 1;
      }
      uVar23 = uVar23 + 1;
    } while (local_238 != uVar23);
  }
  ilu_countnz(local_278,&nnzL,&nnzU,Glu);
  fixupL(uVar2,perm_r,Glu);
  zLUWorkFree(iwork,zwork,Glu);
  superlu_free(xplore);
  superlu_free(local_1b0);
  fVar4 = local_198;
  if (local_198 == SamePattern_SameRowPerm) {
    piVar15 = (int_t *)L->Store;
    *piVar15 = nnzL;
    piVar15[1] = Glu->supno[local_b0];
    piVar16 = Glu->xlusup;
    *(void **)(piVar15 + 2) = Glu->lusup;
    *(int_t **)(piVar15 + 4) = piVar16;
    piVar16 = Glu->xlsub;
    *(int_t **)(piVar15 + 6) = Glu->lsub;
    *(int_t **)(piVar15 + 8) = piVar16;
    piVar15 = (int_t *)U->Store;
    *piVar15 = nnzU;
    piVar16 = Glu->usub;
    *(void **)(piVar15 + 2) = Glu->ucol;
    *(int_t **)(piVar15 + 4) = piVar16;
    *(int_t **)(piVar15 + 6) = Glu->xusub;
  }
  else {
    zCreate_SuperNode_Matrix
              (L,local_c8->nrow,uVar2,nnzL,(doublecomplex *)Glu->lusup,Glu->xlusup,Glu->lsub,
               Glu->xlsub,Glu->supno,Glu->xsup,SLU_SC,SLU_Z,SLU_TRLU);
    zCreate_CompCol_Matrix
              (U,uVar2,uVar2,nnzU,(doublecomplex *)Glu->ucol,Glu->usub,Glu->xusub,SLU_NC,SLU_Z,
               SLU_TRU);
  }
  piVar15 = local_120;
  local_40[7] = local_40[0x13] + local_40[0x14] + local_40[7];
  iVar11 = Glu->num_expansions + -1;
  Glu->num_expansions = iVar11;
  stat->expansions = iVar11;
  if (fVar4 == SamePattern_SameRowPerm) {
    superlu_free(local_f0);
  }
  superlu_free(local_d8);
  superlu_free(piVar15);
  superlu_free(local_1b8);
  superlu_free(local_150);
  superlu_free(local_68);
  superlu_free(amax);
  if (local_1f0 != (double *)0x0) {
    superlu_free(local_1f0);
  }
  return;
}

Assistant:

void
zgsitrf(superlu_options_t *options, SuperMatrix *A, int relax, int panel_size,
	int *etree, void *work, int_t lwork, int *perm_c, int *perm_r,
	SuperMatrix *L, SuperMatrix *U, 
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
	SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when
				  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *swap, *iswap; /* swap is used to store the row permutation
				during the factorization. Initially, it is set
				to iperm_c (row indices of Pc*A*Pc').
				iswap is the inverse of swap. After the
				factorization, it is equal to perm_r. */
    int       *iwork;
    doublecomplex   *zwork;
    int       *segrep, *repfnz, *parent;
    int_t     *xplore;
    int       *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int       *marker;
    int       *marker_relax;
    doublecomplex    *dense, *tempv;
    double *dtempv;
    int       *relax_end, *relax_fsupc;
    doublecomplex    *a;
    int_t     *asub;
    int_t     *xa_begin, *xa_end;
    int       *xsup, *supno;
    int_t     *xlsub, *xlusup, *xusub;
    int_t     nzlumax;
    double    *amax; 
    doublecomplex    drop_sum;
    double alpha, omega;  /* used in MILU, mimicking DRIC */
    double    *dwork2;	   /* used by the second dropping rule */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    double    drop_tol = options->ILU_DropTol; /* tau */
    double    fill_ini = options->ILU_FillTol; /* tau^hat */
    double    gamma = options->ILU_FillFactor;
    int       drop_rule = options->ILU_DropRule;
    milu_t    milu = options->ILU_MILU;
    double    fill_tol;
    int       pivrow;	/* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo;
    int       m, n, min_mn, jsupno, fsupc;
    int_t     new_next, nextlu, nextu;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    int       last_drop;/* the last column which the dropping rules applied */
    int       quota;
    int       nnzAj;	/* number of nonzeros in A(:,1:j) */
    int       nnzLj, nnzUj;
    double    tol_L = drop_tol, tol_U = drop_tol;
    doublecomplex zero = {0.0, 0.0};
    double one = 1.0;

    /* Executable */	   
    iinfo    = 0;
    m	     = A->nrow;
    n	     = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a	     = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = zLUMemInit(fact, work, lwork, m, n, Astore->nnz, panel_size,
		       gamma, L, U, Glu, &iwork, &zwork);
    if ( *info ) return;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;

    int_t *xprune;
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    marker_relax = int32Malloc(m);
    SUPERLU_FREE(xprune); /* not used in ILU */
    
    zSetRWork(m, panel_size, zwork, &dense, &tempv);

    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }

    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;
    swap = (int *)intMalloc(n);
    for (k = 0; k < n; k++) swap[k] = iperm_c[k];
    iswap = (int *)intMalloc(n);
    for (k = 0; k < n; k++) iswap[k] = perm_c[k];
    amax = (double *) SUPERLU_MALLOC(panel_size * sizeof(double));
    if (drop_rule & DROP_SECONDARY)
	dwork2 = SUPERLU_MALLOC(n * sizeof(double));
    else
	dwork2 = NULL;

    nnzAj = 0;
    nnzLj = 0;
    nnzUj = 0;
    last_drop = SUPERLU_MAX(min_mn - 2 * sp_ienv(7), (int)(min_mn * 0.95));
    alpha = pow((double)n, -1.0 / options->ILU_MILU_Dim);

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    relax_fsupc = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES )
	ilu_heap_relax_snode(n, etree, relax, marker, relax_end, relax_fsupc);
    else
	ilu_relax_snode(n, etree, relax, marker, relax_end, relax_fsupc);

    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* Mark the rows used by relaxed supernodes */
    ifill (marker_relax, m, SLU_EMPTY);
    i = mark_relax(m, relax_end, relax_fsupc, xa_begin, xa_end,
	         asub, marker_relax);
#if ( PRNTlevel >= 1)
    printf("%d relaxed supernodes.\n", (int)i);
#endif

    /*
     * Work on one "panel" at a time. A panel is one of the following:
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* Drop small rows in the previous supernode. */
	    if (jcol > 0 && jcol < last_drop) {
		int first = xsup[supno[jcol - 1]];
		int last = jcol - 1;
		int quota;

		/* Compute the quota */
		if (drop_rule & DROP_PROWS)
		    quota = gamma * Astore->nnz / m * (m - first) / m
			    * (last - first + 1);
		else if (drop_rule & DROP_COLUMN) {
		    int i;
		    quota = 0;
		    for (i = first; i <= last; i++)
			quota += xa_end[i] - xa_begin[i];
		    quota = gamma * quota * (m - first) / m;
		} else if (drop_rule & DROP_AREA)
		    quota = gamma * nnzAj * (1.0 - 0.5 * (last + 1.0) / m)
			    - nnzLj;
		else
		    quota = m * n;
		fill_tol = pow(fill_ini, 1.0 - 0.5 * (first + last) / min_mn);

		/* Drop small rows */
                dtempv = (double *) tempv;
		i = ilu_zdrop_row(options, first, last, tol_L, quota, &nnzLj,
				  &fill_tol, Glu, dtempv, dwork2, 0);
		/* Reset the parameters */
		if (drop_rule & DROP_DYNAMIC) {
		    if (gamma * nnzAj * (1.0 - 0.5 * (last + 1.0) / m)
			     < nnzLj)
			tol_L = SUPERLU_MIN(1.0, tol_L * 2.0);
		    else
			tol_L = SUPERLU_MAX(drop_tol, tol_L * 0.5);
		}
		if (fill_tol < 0) iinfo -= (int)fill_tol;
#ifdef DEBUG
		num_drop_L += i * (last - first + 1);
#endif
	    }

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol)
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = ilu_zsnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
					 marker, Glu)) != 0 )
		return;

	    nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ((*info = zLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)))
		    return;
	    }

	    for (icol = jcol; icol <= kcol; icol++) {
		xusub[icol+1] = nextu;

		amax[0] = 0.0;
		/* Scatter into SPA dense[*] */
		for (k = xa_begin[icol]; k < xa_end[icol]; k++) {
                    register double tmp = z_abs1 (&a[k]);
		    if (tmp > amax[0]) amax[0] = tmp;
		    dense[asub[k]] = a[k];
		}
		nnzAj += xa_end[icol] - xa_begin[icol];
		if (amax[0] == 0.0) {
		    amax[0] = fill_ini;
#if ( PRNTlevel >= 1)
		    printf("Column %d is entirely zero!\n", icol);
		    fflush(stdout);
#endif
		}

		/* Numeric update within the snode */
		zsnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if (usepr) pivrow = iperm_r[icol];
		fill_tol = pow(fill_ini, 1.0 - (double)icol / (double)min_mn);
		if ( (*info = ilu_zpivotL(icol, diag_pivot_thresh, &usepr,
					  perm_r, iperm_c[icol], swap, iswap,
					  marker_relax, &pivrow,
                                          amax[0] * fill_tol, milu, zero,
                                          Glu, stat)) ) {
		    iinfo++;
		    marker[pivrow] = kcol;
		}

	    }

	    jcol = kcol + 1;

	} else { /* Work on one panel of panel_size columns */

	    /* Adjust panel_size so that a panel won't overlap with the next
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++)
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    ilu_zpanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
                          dense, amax, panel_lsub, segrep, repfnz,
                          marker, parent, xplore, Glu);

	    /* numeric sup-panel updates in topological order */
	    zpanel_bmod(m, panel_size, jcol, nseg1, dense,
			tempv, segrep, repfnz, Glu, stat);

	    /* Sparse LU within the panel, and below panel diagonal */
	    for (jj = jcol; jj < jcol + panel_size; jj++) {

		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

		nnzAj += xa_end[jj] - xa_begin[jj];

		if ((*info = ilu_zcolumn_dfs(m, jj, perm_r, &nseg,
					     &panel_lsub[k], segrep, &repfnz[k],
					     marker, parent, xplore, Glu)))
		    return;

		/* Numeric updates */
		if ((*info = zcolumn_bmod(jj, (nseg - nseg1), &dense[k],
					  tempv, &segrep[nseg1], &repfnz[k],
					  jcol, Glu, stat)) != 0) return;

		/* Make a fill-in position if the column is entirely zero */
		if (xlsub[jj + 1] == xlsub[jj]) {
		    register int i, row;
		    int_t nextl;
		    int_t nzlmax = Glu->nzlmax;
		    int_t *lsub = Glu->lsub;
		    int *marker2 = marker + 2 * m;

		    /* Allocate memory */
		    nextl = xlsub[jj] + 1;
		    if (nextl >= nzlmax) {
			int error = zLUMemXpand(jj, nextl, LSUB, &nzlmax, Glu);
			if (error) { *info = error; return; }
			lsub = Glu->lsub;
		    }
		    xlsub[jj + 1]++;
		    assert(xlusup[jj]==xlusup[jj+1]);
		    xlusup[jj + 1]++;
		    ((doublecomplex *) Glu->lusup)[xlusup[jj]] = zero;

		    /* Choose a row index (pivrow) for fill-in */
		    for (i = jj; i < n; i++)
			if (marker_relax[swap[i]] <= jj) break;
		    row = swap[i];
		    marker2[row] = jj;
		    lsub[xlsub[jj]] = row;
#ifdef DEBUG
		    printf("Fill col %d.\n", (int)jj);
		    fflush(stdout);
#endif
		}

		/* Computer the quota */
		if (drop_rule & DROP_PROWS)
		    quota = gamma * Astore->nnz / m * jj / m;
		else if (drop_rule & DROP_COLUMN)
		    quota = gamma * (xa_end[jj] - xa_begin[jj]) *
			    (jj + 1) / m;
		else if (drop_rule & DROP_AREA)
		    quota = gamma * 0.9 * nnzAj * 0.5 - nnzUj;
		else
		    quota = m;

		/* Copy the U-segments to ucol[*] and drop small entries */
		if ((*info = ilu_zcopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					       perm_r, &dense[k], drop_rule,
					       milu, amax[jj - jcol] * tol_U,
					       quota, &drop_sum, &nnzUj, Glu,
					       dwork2)) != 0)
		    return;

		/* Reset the dropping threshold if required */
		if (drop_rule & DROP_DYNAMIC) {
		    if (gamma * 0.9 * nnzAj * 0.5 < nnzLj)
			tol_U = SUPERLU_MIN(1.0, tol_U * 2.0);
		    else
			tol_U = SUPERLU_MAX(drop_tol, tol_U * 0.5);
		}

		if (drop_sum.r != 0.0 || drop_sum.i != 0.0)
		{
                    omega = SUPERLU_MIN(2.0*(1.0-alpha)/z_abs1(&drop_sum), 1.0);
                    zd_mult(&drop_sum, &drop_sum, omega);
		}
		if (usepr) pivrow = iperm_r[jj];
		fill_tol = pow(fill_ini, 1.0 - (double)jj / (double)min_mn);
		if ( (*info = ilu_zpivotL(jj, diag_pivot_thresh, &usepr, perm_r,
					  iperm_c[jj], swap, iswap,
					  marker_relax, &pivrow,
					  amax[jj - jcol] * fill_tol, milu,
					  drop_sum, Glu, stat)) ) {
		    iinfo++;
		    marker[m + pivrow] = jj;
		    marker[2 * m + pivrow] = jj;
		}

		/* Reset repfnz[] for this column */
		resetrep_col (nseg, segrep, &repfnz[k]);

		/* Start a new supernode, drop the previous one */
		if (jj > 0 && supno[jj] > supno[jj - 1] && jj < last_drop) {
		    int first = xsup[supno[jj - 1]];
		    int last = jj - 1;
		    int quota;

		    /* Compute the quota */
		    if (drop_rule & DROP_PROWS)
			quota = gamma * Astore->nnz / m * (m - first) / m
				* (last - first + 1);
		    else if (drop_rule & DROP_COLUMN) {
			int i;
			quota = 0;
			for (i = first; i <= last; i++)
			    quota += xa_end[i] - xa_begin[i];
			quota = gamma * quota * (m - first) / m;
		    } else if (drop_rule & DROP_AREA)
			quota = gamma * nnzAj * (1.0 - 0.5 * (last + 1.0)
				/ m) - nnzLj;
		    else
			quota = m * n;
		    fill_tol = pow(fill_ini, 1.0 - 0.5 * (first + last) /
			    (double)min_mn);

		    /* Drop small rows */
                    dtempv = (double *) tempv;
		    i = ilu_zdrop_row(options, first, last, tol_L, quota,
				      &nnzLj, &fill_tol, Glu, dtempv, dwork2,
				      1);

		    /* Reset the parameters */
		    if (drop_rule & DROP_DYNAMIC) {
			if (gamma * nnzAj * (1.0 - 0.5 * (last + 1.0) / m)
				< nnzLj)
			    tol_L = SUPERLU_MIN(1.0, tol_L * 2.0);
			else
			    tol_L = SUPERLU_MAX(drop_tol, tol_L * 0.5);
		    }
		    if (fill_tol < 0) iinfo -= (int)fill_tol;
#ifdef DEBUG
		    num_drop_L += i * (last - first + 1);
#endif
		} /* if start a new supernode */

	    } /* for */

	    jcol += panel_size; /* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    if ( m > n ) {
	k = 0;
	for (i = 0; i < m; ++i)
	    if ( perm_r[i] == SLU_EMPTY ) {
		perm_r[i] = n + k;
		++k;
	    }
    }

    ilu_countnz(min_mn, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    zLUWorkFree(iwork, zwork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE (xplore);
    SUPERLU_FREE (marker_relax);

    if ( fact == SamePattern_SameRowPerm ) {
	/* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
	   may have changed, */
	((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (doublecomplex *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (doublecomplex *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
	zCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL,
              (doublecomplex *) Glu->lusup, Glu->xlusup,
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
	      SLU_SC, SLU_Z, SLU_TRLU);
	zCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU,
	      (doublecomplex *) Glu->ucol, Glu->usub, Glu->xusub,
	      SLU_NC, SLU_Z, SLU_TRU);
    }

    ops[FACT] += ops[TRSV] + ops[GEMV];
    stat->expansions = --(Glu->num_expansions);

    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);
    SUPERLU_FREE (swap);
    SUPERLU_FREE (iswap);
    SUPERLU_FREE (relax_fsupc);
    SUPERLU_FREE (amax);
    if ( dwork2 ) SUPERLU_FREE (dwork2);

}